

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash.c
# Opt level: O0

ion_err_t oafh_destroy(ion_file_hashmap_t *hash_map)

{
  int iVar1;
  char local_24 [4];
  int actual_filename_length;
  char addr_filename [12];
  ion_file_hashmap_t *hash_map_local;
  
  hash_map->compute_hash = (_func_int_ion_file_hashmap_t_ptr_ion_key_t_int *)0x0;
  hash_map->map_size = 0;
  (hash_map->super).record.key_size = 0;
  (hash_map->super).record.value_size = 0;
  addr_filename._4_8_ = hash_map;
  iVar1 = dictionary_get_filename((hash_map->super).id,"oaf",local_24);
  if (iVar1 < 0xc) {
    if (*(long *)(addr_filename._4_8_ + 0x30) == 0) {
      hash_map_local._7_1_ = '\x04';
    }
    else {
      fclose(*(FILE **)(addr_filename._4_8_ + 0x30));
      remove(local_24);
      *(undefined8 *)(addr_filename._4_8_ + 0x30) = 0;
      hash_map_local._7_1_ = '\0';
    }
  }
  else {
    hash_map_local._7_1_ = '\x04';
  }
  return hash_map_local._7_1_;
}

Assistant:

ion_err_t
oafh_destroy(
	ion_file_hashmap_t *hash_map
) {
	hash_map->compute_hash				= NULL;
	hash_map->map_size					= 0;
	hash_map->super.record.key_size		= 0;
	hash_map->super.record.value_size	= 0;

	char addr_filename[ION_MAX_FILENAME_LENGTH];

	int actual_filename_length = dictionary_get_filename(hash_map->super.id, "oaf", addr_filename);

	if (actual_filename_length >= ION_MAX_FILENAME_LENGTH) {
		return err_dictionary_destruction_error;
	}

	if (hash_map->file != NULL) {
		/* check to ensure that you are not freeing something already free */
		fclose(hash_map->file);
		fremove(addr_filename);
		hash_map->file = NULL;
		return err_ok;
	}
	else {
		return err_dictionary_destruction_error;
	}
}